

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O3

void rtext_senditup(_rtext *x,int action,int *widthp,int *heightp,int *indexp)

{
  bool bVar1;
  long lVar2;
  _rtext *p_Var3;
  short sVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  _glist *in_RAX;
  char *pcVar13;
  t_atom *ptVar14;
  char *pcVar15;
  ulong uVar16;
  t_symbol *ptVar17;
  short sVar18;
  t_text *ptVar19;
  _glist *p_Var20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  undefined4 uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  int outchars_b;
  int local_1b4;
  char *local_1b0;
  int local_1a4;
  _rtext *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  ulong local_188;
  int *local_180;
  _glist *local_178;
  int local_16c;
  int local_168;
  int local_164;
  int *local_160;
  int *local_158;
  ulong local_150;
  ulong local_148;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int fontheight;
  int fontwidth;
  int guifontsize;
  int newindex;
  int newheight;
  int newwidth;
  char *local_110;
  char *local_108;
  char smallbuf [200];
  
  outchars_b = 0;
  local_190 = action;
  local_178 = glist_getcanvas(in_RAX);
  text_getfont(x->x_text,x->x_glist,&fontwidth,&fontheight,&guifontsize);
  if (x->x_bufsize < 100) {
    pcVar13 = smallbuf;
  }
  else {
    pcVar13 = (char *)getbytes((ulong)(uint)x->x_bufsize * 2 + 1);
  }
  *pcVar13 = '\0';
  ptVar19 = x->x_text;
  uVar25 = (ulong)(uint)fontheight;
  local_1b0 = pcVar13;
  local_1a0 = x;
  local_158 = indexp;
  if ((~ptVar19->field_0x2e & 3) != 0) {
    local_13c = (int)ptVar19->te_width;
    local_168 = 0x3c;
    if (ptVar19->te_width != 0) {
      local_168 = local_13c;
    }
    local_194 = fontwidth;
    iVar5 = u8_charnum(x->x_buf,x->x_bufsize);
    local_138 = (local_194 / 2 + *widthp) / local_194;
    local_130 = *heightp / fontheight;
    if (iVar5 < 1) {
      local_18c = 0;
      local_1b4 = 0;
      local_1a4 = 0;
      iVar8 = 0;
LAB_00152f0a:
      *indexp = outchars_b;
    }
    else {
      local_18c = 0;
      local_1b4 = 0;
      iVar11 = 0;
      uVar16 = 0;
      iVar10 = 0;
      local_1a4 = 0;
      local_16c = 0;
      local_180 = widthp;
      local_160 = heightp;
      local_148 = uVar25;
      local_134 = iVar5;
      iVar8 = 0;
      do {
        local_164 = iVar8;
        p_Var3 = local_1a0;
        iVar12 = local_168;
        if (iVar5 < local_168) {
          iVar12 = iVar5;
        }
        local_150 = (ulong)(uint)local_1a0->x_bufsize;
        uVar25 = (ulong)(int)uVar16;
        local_188 = uVar16;
        iVar8 = u8_offset(local_1a0->x_buf + uVar25,iVar12);
        pcVar13 = p_Var3->x_buf;
        if (iVar8 != 0) {
          lVar23 = 0;
          do {
            if ((pcVar13 + uVar25)[lVar23] == '\n') {
              iVar8 = (int)lVar23;
              goto LAB_00152c6b;
            }
            lVar23 = lVar23 + 1;
          } while (iVar8 != lVar23);
        }
        uVar24 = 0;
        iVar27 = (int)local_188;
        if (local_168 < iVar5) {
          lVar23 = 0;
          do {
            if (-lVar23 == (long)(iVar8 + 1)) goto LAB_00152c9e;
            lVar22 = lVar23 + -1;
            lVar2 = lVar23 + uVar25 + (long)(iVar8 + 1) + -1;
            lVar23 = lVar22;
          } while (pcVar13[lVar2] != ' ');
          iVar5 = (int)lVar22;
          if (0 < iVar8 + iVar5 + 2) {
            iVar8 = iVar8 + iVar5 + 1;
LAB_00152c6b:
            local_150 = uVar25;
            iVar12 = u8_charnum(pcVar13 + uVar25,iVar8);
            pcVar13 = local_1a0->x_buf;
            uVar24 = 1;
            iVar27 = (int)local_188;
            uVar25 = local_150;
          }
        }
        else {
          iVar8 = (int)local_150 - iVar27;
          iVar12 = iVar5;
        }
LAB_00152c9e:
        local_188 = CONCAT44(local_188._4_4_,uVar24);
        if (local_1a4 == local_130) {
          iVar5 = iVar12;
          if (local_138 < iVar12) {
            iVar5 = local_138;
          }
          if (local_138 < 0) {
            iVar5 = 0;
          }
          iVar5 = u8_offset(pcVar13 + uVar25,iVar5);
          *local_158 = iVar5 + iVar27;
          pcVar13 = local_1a0->x_buf;
          local_16c = 1;
        }
        p_Var3 = local_1a0;
        strncpy(local_1b0 + outchars_b,pcVar13 + uVar25,(long)iVar8);
        iVar5 = p_Var3->x_selstart;
        if (iVar5 < iVar27) {
          uVar16 = (ulong)(uint)(iVar27 + iVar8 + (int)local_188);
        }
        else {
          uVar9 = iVar27 + iVar8 + (int)local_188;
          uVar16 = (ulong)uVar9;
          if (iVar5 <= (int)uVar9) {
            local_18c = iVar5 + iVar11 + outchars_b;
          }
        }
        iVar5 = p_Var3->x_selend;
        iVar6 = (int)uVar16;
        iVar11 = iVar11 + iVar5 + outchars_b;
        if (iVar6 < iVar5) {
          iVar11 = local_1b4;
        }
        if (iVar27 <= iVar5) {
          local_1b4 = iVar11;
        }
        iVar8 = iVar8 + outchars_b;
        outchars_b = iVar8;
        if (iVar6 < p_Var3->x_bufsize) {
          outchars_b = iVar8 + 1;
          local_1b0[iVar8] = '\n';
        }
        iVar10 = iVar10 + (int)local_188 + iVar12;
        iVar8 = local_164;
        if (local_164 < iVar12) {
          iVar8 = iVar12;
        }
        local_1a4 = local_1a4 + 1;
        iVar11 = -iVar6;
        iVar5 = local_134 - iVar10;
      } while (iVar5 != 0 && iVar10 <= local_134);
      fontheight = (int)local_148;
      indexp = local_158;
      heightp = local_160;
      x = local_1a0;
      pcVar13 = local_1b0;
      widthp = local_180;
      if (local_16c == 0) goto LAB_00152f0a;
    }
    iVar5 = local_13c;
    if (((short)local_13c == 0) &&
       (iVar5 = iVar8, iVar8 < (int)((uint)((x->x_text->field_0x2e & 3) != 0) * 2 + 1))) {
      do {
        lVar23 = (long)outchars_b;
        outchars_b = outchars_b + 1;
        pcVar13[lVar23] = ' ';
        iVar5 = iVar5 + 1;
      } while (iVar5 < (int)((uint)((x->x_text->field_0x2e & 3) != 0) * 2 + 1));
    }
    *widthp = iVar5 * local_194;
    *heightp = (local_1a4 + (uint)(local_1a4 == 0)) * fontheight;
    iVar5 = glist_getzoom(x->x_glist);
    if (iVar5 < 2) {
      *widthp = *widthp + 4;
      iVar5 = 5;
    }
    else {
      iVar5 = glist_getzoom(x->x_glist);
      *widthp = *widthp + iVar5 * 4;
      iVar5 = glist_getzoom(x->x_glist);
      iVar5 = iVar5 * 5;
    }
    iVar5 = iVar5 + *heightp;
    goto LAB_00153041;
  }
  local_1b4 = *widthp / fontwidth;
  *indexp = 0;
  local_148 = uVar25;
  if (0 < ptVar19->te_width) {
    iVar5 = binbuf_getnatom(ptVar19->te_binbuf);
    ptVar19 = x->x_text;
    if (iVar5 == 1) {
      ptVar14 = binbuf_getvec(ptVar19->te_binbuf);
      pcVar13 = local_1b0;
      ptVar19 = x->x_text;
      if (ptVar14->a_type == A_FLOAT) {
        iVar5 = x->x_bufsize;
        if (ptVar19->te_width < iVar5) {
          local_1a4 = (int)ptVar19->te_width;
          strncpy(local_1b0,x->x_buf,(long)iVar5);
          pcVar13[x->x_bufsize] = '\0';
          if (0 < (long)x->x_bufsize) {
            pcVar15 = local_1b0 + x->x_bufsize;
            pcVar13 = local_1b0;
            do {
              if (*pcVar13 == '.') {
                lVar23 = 0;
                goto LAB_001533be;
              }
              pcVar13 = pcVar13 + 1;
            } while (pcVar13 < pcVar15);
          }
          goto LAB_00153411;
        }
      }
    }
  }
  sVar18 = (short)*(undefined4 *)&ptVar19->te_width;
  sVar4 = 1000;
  if (0 < sVar18) {
    sVar4 = sVar18;
  }
  outchars_b = 0;
  if (x->x_bufsize < 1) {
    uVar9 = 0;
    iVar5 = outchars_b;
    local_180 = widthp;
  }
  else {
    local_194 = fontwidth;
    uVar26 = 1;
    local_180 = widthp;
    local_160 = heightp;
    while( true ) {
      iVar5 = outchars_b;
      uVar9 = uVar26 - 1;
      uVar7 = u8_nextchar(local_1a0->x_buf,&outchars_b);
      p_Var3 = local_1a0;
      if ((int)uVar9 < local_1b4) {
        *indexp = outchars_b;
      }
      heightp = local_160;
      x = local_1a0;
      fontwidth = local_194;
      if ((uVar7 == 10) || (uVar7 == 0)) break;
      lVar23 = (long)iVar5;
      pcVar13 = local_1b0 + lVar23;
      memcpy(pcVar13,local_1a0->x_buf + lVar23,outchars_b - lVar23);
      iVar8 = p_Var3->x_bufsize;
      if ((outchars_b < iVar8 && (int)sVar4 == uVar26) &&
         (outchars_b + 1 < iVar8 || p_Var3->x_buf[outchars_b] != ' ')) {
        *pcVar13 = '>';
        iVar8 = local_1a0->x_bufsize;
      }
      indexp = local_158;
      heightp = local_160;
      x = local_1a0;
      uVar9 = uVar26;
      fontwidth = local_194;
      iVar5 = outchars_b;
      if ((iVar8 <= outchars_b) || (bVar1 = (int)sVar4 <= (int)uVar26, uVar26 = uVar26 + 1, bVar1))
      break;
    }
  }
  outchars_b = iVar5;
  sVar4 = x->x_text->te_width;
  uVar26 = 3;
  if (3 < uVar9) {
    uVar26 = uVar9;
  }
  if (0 < sVar4) {
    uVar26 = (int)sVar4;
  }
  *local_180 = uVar26 * fontwidth;
  local_1b0[outchars_b] = '\0';
  widthp = local_180;
  goto LAB_00152ff0;
  while (lVar23 = lVar22 + 1, 0xf5 < (byte)(pcVar13[lVar22 + 1] - 0x3aU)) {
LAB_001533be:
    lVar22 = lVar23;
    if (pcVar15 <= pcVar13 + lVar22 + 1) {
      if (iVar5 - local_1a4 <= lVar22) goto LAB_00153431;
      goto LAB_00153411;
    }
  }
  if (lVar22 < iVar5 - local_1a4) {
LAB_00153411:
    local_1b0[(long)x->x_text->te_width + -1] = '>';
    local_1b0[x->x_text->te_width] = '\0';
  }
  else {
    pcVar21 = pcVar13 + lVar23;
    pcVar13 = pcVar13 + ((long)local_1a4 - (long)iVar5) + lVar23;
    do {
      *pcVar13 = *pcVar21;
      pcVar13 = pcVar13 + 1;
      pcVar21 = pcVar21 + 1;
    } while (pcVar21 < pcVar15);
  }
LAB_00153431:
  outchars_b = (int)x->x_text->te_width;
  *local_158 = local_1b4;
  *widthp = fontwidth * outchars_b;
  indexp = local_158;
LAB_00152ff0:
  uVar25 = local_148;
  pcVar13 = local_1b0;
  iVar5 = *indexp;
  iVar8 = outchars_b;
  if (iVar5 < outchars_b) {
    iVar8 = iVar5;
  }
  if (outchars_b < iVar5 || iVar8 < 0) {
    iVar5 = 0;
    if (0 < iVar8) {
      iVar5 = iVar8;
    }
    *indexp = iVar5;
  }
  local_18c = x->x_selstart;
  local_1b4 = x->x_selend;
  iVar5 = glist_getzoom(x->x_glist);
  *widthp = *widthp + iVar5 * 2;
  iVar5 = glist_getzoom(x->x_glist);
  iVar5 = (int)uVar25 + iVar5 * 4;
LAB_00153041:
  *heightp = iVar5;
  pcVar13[outchars_b] = '\0';
  if (local_190 != 0) {
    ptVar19 = x->x_text;
    sVar4 = ptVar19->te_width;
    if ((sVar4 != 0) && ((~ptVar19->field_0x2e & 3) != 0)) {
      _newwidth = (char *)((ulong)_newwidth & 0xffffffff00000000);
      newheight = 0;
      newindex = 0;
      ptVar19->te_width = 0;
      rtext_senditup(x,0,&newwidth,&newheight,&newindex);
      if (newwidth != *widthp) {
        x->x_text->te_width = sVar4;
      }
    }
    if ((local_178->field_0xe8 & 1) != 0) {
      if (local_190 == 2) {
        pcVar13 = x->x_tag;
        pdgui_vmess("pdtk_text_set","cs s",local_178,pcVar13,local_1b0);
        if ((*widthp != x->x_drawnwidth) || (*heightp != x->x_drawnheight)) {
          text_drawborder(x->x_text,x->x_glist,pcVar13,*widthp,*heightp,0);
        }
        p_Var20 = local_178;
        iVar8 = local_18c;
        iVar5 = local_1b4;
        if (x->x_active != 0) {
          local_180 = widthp;
          if (local_18c < local_1b4) {
            uVar9 = u8_charnum(x->x_buf,local_18c);
            p_Var20 = local_178;
            pdgui_vmess((char *)0x0,"crr si",local_178,"select","from",pcVar13,(ulong)uVar9);
            iVar5 = u8_charnum(x->x_buf,iVar5);
            pdgui_vmess((char *)0x0,"crr si",p_Var20,"select","to",pcVar13,(ulong)(iVar5 - 1));
            pcVar13 = "";
          }
          else {
            pdgui_vmess((char *)0x0,"crr",local_178,"select","clear");
            uVar9 = u8_charnum(x->x_buf,iVar8);
            pdgui_vmess((char *)0x0,"cr si",p_Var20,"icursor",pcVar13,(ulong)uVar9);
            pdgui_vmess("focus","c",p_Var20);
          }
          pdgui_vmess((char *)0x0,"crs",p_Var20,"focus",pcVar13);
          widthp = local_180;
        }
      }
      else if (local_190 == 1) {
        _newwidth = x->x_tag;
        ptVar17 = gensym(&DAT_001b83a8 +
                         *(int *)(&DAT_001b83a8 + (ulong)((byte)x->x_text->field_0x2e & 3) * 4));
        local_110 = ptVar17->s_name;
        local_108 = "text";
        iVar5 = glist_getzoom(x->x_glist);
        if (iVar5 < 2) {
          iVar5 = 3;
          iVar8 = 2;
        }
        else {
          iVar8 = glist_getzoom(x->x_glist);
          iVar8 = iVar8 * 2;
          iVar5 = glist_getzoom(x->x_glist);
          iVar5 = iVar5 * 3;
        }
        iVar10 = text_xpix(x->x_text,x->x_glist);
        iVar11 = text_ypix(x->x_text,x->x_glist);
        iVar12 = glist_isselected(x->x_glist,&x->x_text->te_g);
        pcVar13 = "blue";
        if (iVar12 == 0) {
          pcVar13 = "black";
        }
        pdgui_vmess("pdtk_text_new","c S ii s i r",local_178,3,&newwidth,
                    (ulong)(uint)(iVar8 + iVar10),(ulong)(uint)(iVar11 + iVar5),local_1b0,
                    (ulong)(uint)guifontsize,pcVar13);
      }
    }
  }
  x->x_drawnwidth = *widthp;
  x->x_drawnheight = *heightp;
  if (local_1b0 != smallbuf) {
    freebytes(local_1b0,(long)x->x_bufsize * 2 + 1);
  }
  return;
}

Assistant:

static void rtext_senditup(t_rtext *x, int action, int *widthp, int *heightp,
    int *indexp)
{
    char smallbuf[200], *tempbuf;
    int outchars_b = 0, guifontsize, fontwidth, fontheight;
    t_canvas *canvas = glist_getcanvas(x->x_glist);
    int selstart_b, selend_b;   /* beginning and end of selection in bytes */
        /* if we're a GOP (the new, "goprect" style) borrow the font size
        from the inside to preserve the spacing */

    text_getfont(x->x_text, x->x_glist, &fontwidth, &fontheight, &guifontsize);
    if (x->x_bufsize >= 100)
         tempbuf = (char *)t_getbytes(2 * x->x_bufsize + 1);
    else tempbuf = smallbuf;
    tempbuf[0] = 0;

    if (x->x_text->te_type == T_ATOM)
        rtext_formatatom(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b,  &selend_b,
            fontwidth, fontheight);
    else rtext_formattext(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b, &selend_b,
            fontwidth, fontheight);
    tempbuf[outchars_b]=0;

    if (action && x->x_text->te_width && x->x_text->te_type != T_ATOM)
    {
            /* if our width is specified but the "natural" width is the
            same as the specified width, set specified width to zero
            so future text editing will automatically change width.
            Except atoms whose content changes at runtime. */
        int widthwas = x->x_text->te_width, newwidth = 0, newheight = 0,
            newindex = 0;
        x->x_text->te_width = 0;
        rtext_senditup(x, 0, &newwidth, &newheight, &newindex);
        if (newwidth != *widthp)
            x->x_text->te_width = widthwas;
    }

    if (action && !canvas->gl_havewindow)
        action = 0;

    if (action == SEND_FIRST)
    {
        const char *tags[] = {x->x_tag, rtext_gettype(x)->s_name, "text"};
        int lmargin = LMARGIN, tmargin = TMARGIN;
        if (glist_getzoom(x->x_glist) > 1)
        {
            /* zoom margins */
            lmargin *= glist_getzoom(x->x_glist);
            tmargin *= glist_getzoom(x->x_glist);
        }
            /* we add an extra space to the string just in case the last
            character is an unescaped backslash ('\') which would have confused
            tcl/tk by escaping the close brace otherwise.  The GUI code
            drops the last character in the string. */
        pdgui_vmess("pdtk_text_new", "c S ii s i r",
            canvas,
            3, tags,
            text_xpix(x->x_text, x->x_glist) + lmargin, text_ypix(x->x_text, x->x_glist) + tmargin,
            tempbuf,
            guifontsize,
            (glist_isselected(x->x_glist, &x->x_text->te_g)? "blue" : "black"));
    }
    else if (action == SEND_UPDATE)
    {
        pdgui_vmess("pdtk_text_set", "cs s",
                  canvas, x->x_tag,
                  tempbuf);
        if (*widthp != x->x_drawnwidth || *heightp != x->x_drawnheight)
            text_drawborder(x->x_text, x->x_glist, x->x_tag,
                *widthp, *heightp, 0);
        if (x->x_active)
        {
            if (selend_b > selstart_b)
            {
                pdgui_vmess(0, "crr si",
                    canvas, "select", "from",
                    x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess(0, "crr si",
                    canvas, "select", "to",
                    x->x_tag, u8_charnum(x->x_buf, selend_b) - 1);
                pdgui_vmess(0, "crs", canvas, "focus", "");
            }
            else
            {
                pdgui_vmess(0, "crr", canvas, "select", "clear");
                pdgui_vmess(0, "cr si", canvas, "icursor", x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess("focus", "c", canvas);
                pdgui_vmess(0, "crs", canvas, "focus", x->x_tag);
            }
        }
    }
    x->x_drawnwidth = *widthp;
    x->x_drawnheight = *heightp;

    if (tempbuf != smallbuf)
        t_freebytes(tempbuf, 2 * x->x_bufsize + 1);
}